

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::BitsToFloatCase::compare
          (BitsToFloatCase *this,void **inputs,void **outputs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  uint uVar6;
  ostringstream *this_00;
  long lVar7;
  Hex<8UL> local_30;
  
  iVar3 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  bVar5 = iVar3 < 1;
  if (0 < iVar3) {
    uVar6 = **inputs;
    uVar1 = **outputs;
    uVar2 = uVar1 - uVar6;
    if (uVar1 < uVar6) {
      uVar2 = -(uVar1 - uVar6);
    }
    lVar7 = 0;
    if (uVar2 == 0) {
      lVar7 = 0;
      do {
        if (iVar3 + -1 == (int)lVar7) {
          return true;
        }
        uVar6 = *(uint *)((long)*inputs + (lVar7 + 1) * 4);
        uVar1 = *(uint *)((long)*outputs + (lVar7 + 1) * 4);
        uVar2 = uVar1 - uVar6;
        if (uVar1 < uVar6) {
          uVar2 = -(uVar1 - uVar6);
        }
        lVar7 = lVar7 + 1;
      } while (uVar2 == 0);
      bVar5 = iVar3 <= (int)lVar7;
    }
    this_00 = &(this->super_CommonFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>
              (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
    poVar4 = (ostream *)std::ostream::operator<<(this_00,(int)lVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
    local_30.value = (deUint64)uVar6;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_30,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," with ULP threshold ",0x14);
    local_30.value = 0;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_30,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", got ULP diff ",0xf);
    local_30.value = (ulong)uVar2;
    tcu::Format::Hex<8UL>::toStream(&local_30,poVar4);
  }
  return bVar5;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			maxUlpDiff		= 0;

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const deUint32	ulpDiff		= getUlpDiff(in0, out0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(tcu::Float32(in0).bits()) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}